

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglrenderer.h
# Opt level: O0

void __thiscall rengine::OpenGLRenderer::prepass(OpenGLRenderer *this,Node *n)

{
  bool bVar1;
  Type TVar2;
  uint uVar3;
  Texture *pTVar4;
  float fVar5;
  vec4 vVar6;
  Node *local_98;
  Node *c;
  float fStack_80;
  mat4 local_7c;
  vec4 local_38;
  RectangleNodeBase *local_28;
  RectangleNode *rn;
  TextureNode *tn;
  Node *n_local;
  OpenGLRenderer *this_local;
  
  tn = (TextureNode *)n;
  n_local = (Node *)this;
  Node::preprocess(n);
  TVar2 = Node::type((Node *)tn);
  switch(TVar2) {
  case TransformNodeType:
    this->m_numTransformNodes = this->m_numTransformNodes + 1;
    fVar5 = TransformNode::projectionDepth((TransformNode *)tn);
    if (0.0 < fVar5) {
      this->m_numTransformNodesWith3d = this->m_numTransformNodesWith3d + 1;
    }
    break;
  case OpacityNodeType:
    fVar5 = OpacityNode::opacity((OpacityNode *)tn);
    if (fVar5 < 1.0) {
      this->m_numLayeredNodes = this->m_numLayeredNodes + 1;
    }
    break;
  case ColorFilterNodeType:
    ColorFilterNode::colorMatrix(&local_7c,(ColorFilterNode *)tn);
    bVar1 = mat4::isIdentity(&local_7c);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      this->m_numLayeredNodes = this->m_numLayeredNodes + 1;
    }
    break;
  case BlurNodeType:
    uVar3 = BlurNode::radius((BlurNode *)tn);
    if (uVar3 != 0) {
      this->m_numLayeredNodes = this->m_numLayeredNodes + 1;
      this->m_additionalQuads = this->m_additionalQuads + 2;
    }
    break;
  case ShadowNodeType:
    vVar6 = ShadowNode::color((ShadowNode *)tn);
    fStack_80 = vVar6.w;
    if (0.0 < fStack_80) {
      this->m_numLayeredNodes = this->m_numLayeredNodes + 1;
      this->m_additionalQuads = this->m_additionalQuads + 3;
    }
    break;
  default:
    break;
  case RectangleNodeType:
    local_28 = (RectangleNodeBase *)tn;
    fVar5 = RectangleNodeBase::width((RectangleNodeBase *)tn);
    bVar1 = false;
    if ((fVar5 != 0.0) || (NAN(fVar5))) {
      fVar5 = RectangleNodeBase::height(local_28);
      bVar1 = false;
      if ((fVar5 != 0.0) || (NAN(fVar5))) {
        local_38 = RectangleNode::color((RectangleNode *)local_28);
        bVar1 = 0.001 <= local_38.w;
      }
    }
    if (bVar1) {
      this->m_numRectangleNodes = this->m_numRectangleNodes + 1;
    }
    break;
  case TextureNodeType:
    rn = (RectangleNode *)tn;
    fVar5 = RectangleNodeBase::width((RectangleNodeBase *)tn);
    if ((fVar5 != 0.0) || (NAN(fVar5))) {
      fVar5 = RectangleNodeBase::height((RectangleNodeBase *)rn);
      if (((fVar5 != 0.0) || (NAN(fVar5))) &&
         (pTVar4 = TextureNode::texture((TextureNode *)rn), pTVar4 != (Texture *)0x0)) {
        this->m_numTextureNodes = this->m_numTextureNodes + 1;
      }
    }
    break;
  case RenderNodeType:
    this->m_numRenderNodes = this->m_numRenderNodes + 1;
  }
  for (local_98 = Node::child((Node *)tn); local_98 != (Node *)0x0;
      local_98 = Node::sibling(local_98)) {
    prepass(this,local_98);
  }
  return;
}

Assistant:

inline void OpenGLRenderer::prepass(Node *n)
{
    n->preprocess();
    switch (n->type()) {
    case Node::TextureNodeType: {
        TextureNode *tn = static_cast<TextureNode *>(n);
        if (tn->width() != 0.0f && tn->height() != 0.0f && tn->texture() != nullptr)
            ++m_numTextureNodes;
    }   break;
    case Node::RectangleNodeType: {
        RectangleNode *rn = static_cast<RectangleNode *>(n);
        if (rn->width() != 0.0f && rn->height() != 0.0f && !(rn->color().w < RENGINE_RENDERER_ALPHA_THRESHOLD))
            ++m_numRectangleNodes;
    }   break;
    case Node::TransformNodeType:
        ++m_numTransformNodes;
        if (static_cast<TransformNode *>(n)->projectionDepth() > 0)
            ++m_numTransformNodesWith3d;
        break;
    // All layered nodes take this path..
    case Node::ColorFilterNodeType:
        if (!static_cast<ColorFilterNode *>(n)->colorMatrix().isIdentity())
            ++m_numLayeredNodes;
        break;
    case Node::OpacityNodeType:
        if (static_cast<OpacityNode *>(n)->opacity() < 1)
            ++m_numLayeredNodes;
        break;
    case Node::BlurNodeType:
        if (static_cast<BlurNode *>(n)->radius() > 0) {
            ++m_numLayeredNodes;
            m_additionalQuads += 2;
        }
        break;
    case Node::ShadowNodeType:
        if (static_cast<ShadowNode *>(n)->color().w > 0) {
            ++m_numLayeredNodes;
            m_additionalQuads += 3;
        }
        break;
    case Node::RenderNodeType:
        ++m_numRenderNodes;
        break;

    default:
        // ignore...
        break;
    }

    for (Node *c = n->child(); c; c = c->sibling())
        prepass(c);
}